

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::AddTxAnnouncement
          (PeerManagerImpl *this,CNode *node,GenTxid *gtxid,microseconds current_time)

{
  microseconds reqtime;
  bool bVar1;
  byte bVar2;
  __int_type _Var3;
  duration<long,_std::ratio<1L,_1000000L>_> *__lhs;
  size_t sVar4;
  CNodeState *pCVar5;
  duration<long,_std::ratio<1L,_1000000L>_> *__rhs;
  long in_RDI;
  long in_FS_OFFSET;
  bool overloaded;
  bool preferred;
  CNodeState *state;
  NodeId nodeid;
  microseconds delay;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffff70;
  PeerManagerImpl *in_stack_ffffffffffffff78;
  __atomic_base<int> *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 uVar6;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::recursive_mutex> *)0x2c63a8);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::mutex> *)0x2c63cc);
  __lhs = (duration<long,_std::ratio<1L,_1000000L>_> *)
          CNode::GetId((CNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = CNode::HasPermission
                    ((CNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),None);
  if ((bVar1) ||
     (sVar4 = TxRequestTracker::Count
                        ((TxRequestTracker *)in_stack_ffffffffffffff78,
                         (NodeId)in_stack_ffffffffffffff70), sVar4 < 5000)) {
    pCVar5 = State(in_stack_ffffffffffffff78,(NodeId)in_stack_ffffffffffffff70);
    memset(local_18,0,8);
    bVar2 = pCVar5->fPreferredDownload & 1;
    if (bVar2 == 0) {
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1l>,void>
                (in_stack_ffffffffffffff70,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
    }
    bVar1 = GenTxid::IsWtxid((GenTxid *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if ((!bVar1) &&
       (_Var3 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff80), 0 < _Var3)) {
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1l>,void>
                (in_stack_ffffffffffffff70,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
    }
    bVar1 = CNode::HasPermission
                      ((CNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),None);
    uVar6 = false;
    if (!bVar1) {
      sVar4 = TxRequestTracker::CountInFlight
                        ((TxRequestTracker *)in_stack_ffffffffffffff78,
                         (NodeId)in_stack_ffffffffffffff70);
      uVar6 = 99 < sVar4;
    }
    if ((bool)uVar6 != false) {
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1l>,void>
                (in_stack_ffffffffffffff70,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
    }
    __rhs = (duration<long,_std::ratio<1L,_1000000L>_> *)(in_RDI + 0x150);
    std::chrono::operator+(__lhs,__rhs);
    reqtime.__r._6_1_ = bVar2;
    reqtime.__r._0_6_ = in_stack_ffffffffffffff88;
    reqtime.__r._7_1_ = uVar6;
    TxRequestTracker::ReceivedInv
              ((TxRequestTracker *)__lhs,(NodeId)__rhs,
               (GenTxid *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),false,
               reqtime);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::AddTxAnnouncement(const CNode& node, const GenTxid& gtxid, std::chrono::microseconds current_time)
{
    AssertLockHeld(::cs_main); // for State
    AssertLockHeld(m_tx_download_mutex); // For m_txrequest
    NodeId nodeid = node.GetId();
    if (!node.HasPermission(NetPermissionFlags::Relay) && m_txrequest.Count(nodeid) >= MAX_PEER_TX_ANNOUNCEMENTS) {
        // Too many queued announcements from this peer
        return;
    }
    const CNodeState* state = State(nodeid);

    // Decide the TxRequestTracker parameters for this announcement:
    // - "preferred": if fPreferredDownload is set (= outbound, or NetPermissionFlags::NoBan permission)
    // - "reqtime": current time plus delays for:
    //   - NONPREF_PEER_TX_DELAY for announcements from non-preferred connections
    //   - TXID_RELAY_DELAY for txid announcements while wtxid peers are available
    //   - OVERLOADED_PEER_TX_DELAY for announcements from peers which have at least
    //     MAX_PEER_TX_REQUEST_IN_FLIGHT requests in flight (and don't have NetPermissionFlags::Relay).
    auto delay{0us};
    const bool preferred = state->fPreferredDownload;
    if (!preferred) delay += NONPREF_PEER_TX_DELAY;
    if (!gtxid.IsWtxid() && m_wtxid_relay_peers > 0) delay += TXID_RELAY_DELAY;
    const bool overloaded = !node.HasPermission(NetPermissionFlags::Relay) &&
        m_txrequest.CountInFlight(nodeid) >= MAX_PEER_TX_REQUEST_IN_FLIGHT;
    if (overloaded) delay += OVERLOADED_PEER_TX_DELAY;
    m_txrequest.ReceivedInv(nodeid, gtxid, preferred, current_time + delay);
}